

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderIncompleteLayeredFBOTest::iterate(GeometryShaderIncompleteLayeredFBOTest *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint *pGVar3;
  NotSupportedError *this_00;
  char *description;
  byte bVar4;
  uint n_incomplete_fbo_id;
  long lVar5;
  GLuint incomplete_fbo_ids [4];
  GLuint local_38 [6];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    pGVar3 = (GLuint *)operator_new__(0x1c);
    this->m_to_ids = pGVar3;
    GeometryShaderLayeredFBOShared::initTOs(gl,gl->texStorage3DMultisample,pGVar3);
    pGVar3 = (GLuint *)operator_new__(0x10);
    this->m_fbo_ids = pGVar3;
    GeometryShaderLayeredFBOShared::initFBOs(gl,gl->framebufferTexture,this->m_to_ids,pGVar3);
    pGVar3 = this->m_fbo_ids;
    local_38[0] = *pGVar3;
    local_38[1] = pGVar3[1];
    local_38[2] = pGVar3[2];
    local_38[3] = pGVar3[3];
    bVar4 = 1;
    lVar5 = 0;
    do {
      bVar1 = GeometryShaderLayeredFBOShared::checkFBOCompleteness
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,gl,
                         local_38[lVar5],
                         (this->super_TestCaseBase).m_glExtTokens.
                         FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS);
      bVar4 = bVar4 & bVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (bVar4 == 0) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar4 == 0)
               ,description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
             ,0x152);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderIncompleteLayeredFBOTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up texture objects */
	m_to_ids = new glw::GLuint[GeometryShaderLayeredFBOShared::n_shared_to_ids];

	GeometryShaderLayeredFBOShared::initTOs(gl, gl.texStorage3DMultisample, m_to_ids);

	/* Set up framebuffer objects */
	m_fbo_ids = new glw::GLuint[GeometryShaderLayeredFBOShared::n_shared_fbo_ids];

	GeometryShaderLayeredFBOShared::initFBOs(gl, gl.framebufferTexture, m_to_ids, m_fbo_ids);

	/* Verify framebuffer completeness */
	const glw::GLuint  incomplete_fbo_ids[] = { m_fbo_ids[0], m_fbo_ids[1], m_fbo_ids[2], m_fbo_ids[3] };
	const unsigned int n_incomplete_fbo_ids = sizeof(incomplete_fbo_ids) / sizeof(incomplete_fbo_ids[0]);

	for (unsigned int n_incomplete_fbo_id = 0; n_incomplete_fbo_id < n_incomplete_fbo_ids; ++n_incomplete_fbo_id)
	{
		result &= GeometryShaderLayeredFBOShared::checkFBOCompleteness(
			m_testCtx, gl, incomplete_fbo_ids[n_incomplete_fbo_id], m_glExtTokens.FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS);
	} /* for (all FBO ids) */

	/* All done */
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}